

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPSymmetricAlgorithm.cpp
# Opt level: O1

void __thiscall
OSSLEVPSymmetricAlgorithm::~OSSLEVPSymmetricAlgorithm(OSSLEVPSymmetricAlgorithm *this)

{
  (this->super_SymmetricAlgorithm)._vptr_SymmetricAlgorithm =
       (_func_int **)&PTR__OSSLEVPSymmetricAlgorithm_0019eec0;
  if ((EVP_CIPHER_CTX *)this->pCurCTX != (EVP_CIPHER_CTX *)0x0) {
    EVP_CIPHER_CTX_free((EVP_CIPHER_CTX *)this->pCurCTX);
  }
  if ((BIGNUM *)this->maximumBytes != (BIGNUM *)0x0) {
    BN_free((BIGNUM *)this->maximumBytes);
  }
  if ((BIGNUM *)this->counterBytes != (BIGNUM *)0x0) {
    BN_free((BIGNUM *)this->counterBytes);
  }
  (this->super_SymmetricAlgorithm)._vptr_SymmetricAlgorithm =
       (_func_int **)&PTR__SymmetricAlgorithm_0019dcf0;
  (this->super_SymmetricAlgorithm).currentAEADBuffer._vptr_ByteString =
       (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&(this->super_SymmetricAlgorithm).currentAEADBuffer.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  return;
}

Assistant:

OSSLEVPSymmetricAlgorithm::~OSSLEVPSymmetricAlgorithm()
{
	/* In case of custom allocator from BIND, even NULL pointer might crash
	 * the library if freed after deinitialization. Do not rely on null handling
	 * as a workaround. */
	if (pCurCTX)
		EVP_CIPHER_CTX_free(pCurCTX);
	if (maximumBytes)
		BN_free(maximumBytes);
	if (counterBytes)
		BN_free(counterBytes);
}